

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmJsonEncode(jx9_value *pIn,json_private_data *pData)

{
  char cVar1;
  uint uVar2;
  SyBlob *pBlob;
  int iVar3;
  sxi32 sVar4;
  sxu32 nSize;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  int c;
  int nByte;
  int local_30;
  sxu32 local_2c;
  
  pBlob = pData->pOut;
  if ((pIn->iFlags & 0x120U) != 0) {
LAB_0011aeff:
    pcVar5 = "null";
    nSize = 4;
LAB_0011af7a:
    sVar4 = SyBlobAppend(pBlob,pcVar5,nSize);
    return sVar4;
  }
  if ((pIn->iFlags & 8U) != 0) {
    jx9MemObjToBool(pIn);
    bVar7 = *(int *)&pIn->x == 0;
    pcVar5 = "true";
    if (bVar7) {
      pcVar5 = "false";
    }
    nSize = bVar7 | 4;
    goto LAB_0011af7a;
  }
  iVar3 = jx9_value_is_numeric(pIn);
  uVar2 = pIn->iFlags;
  if (iVar3 == 0) {
    if ((uVar2 & 1) == 0) {
      if ((uVar2 & 0x40) != 0) {
        pData->isFirst = 1;
        if ((*(byte *)((pIn->x).iVal + 0x40) & 1) == 0) {
          SyBlobAppend(pBlob,"[",1);
          if ((pIn->iFlags & 0x40) != 0) {
            jx9HashmapWalk((jx9_hashmap *)(pIn->x).pOther,VmJsonArrayEncode,pData);
          }
          pcVar5 = "]";
        }
        else {
          SyBlobAppend(pBlob,"{",1);
          if ((pIn->iFlags & 0x40) != 0) {
            jx9HashmapWalk((jx9_hashmap *)(pIn->x).pOther,VmJsonObjectEncode,pData);
          }
          pcVar5 = "}";
        }
        nSize = 1;
        goto LAB_0011af7a;
      }
      goto LAB_0011aeff;
    }
  }
  else if ((uVar2 & 1) == 0) {
    pcVar5 = jx9_value_to_string(pIn,(int *)&local_2c);
    goto LAB_0011b072;
  }
  pcVar5 = jx9_value_to_string(pIn,(int *)&local_2c);
  SyBlobAppend(pBlob,"\"",1);
  if (0 < (long)(int)local_2c) {
    pcVar6 = pcVar5 + (int)local_2c;
    do {
      cVar1 = *pcVar5;
      local_30 = (int)cVar1;
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        SyBlobAppend(pBlob,"\\",1);
      }
      pcVar5 = pcVar5 + 1;
      SyBlobAppend(pBlob,&local_30,1);
    } while (pcVar5 < pcVar6);
  }
  pcVar5 = "\"";
  local_2c = 1;
LAB_0011b072:
  sVar4 = SyBlobAppend(pBlob,pcVar5,local_2c);
  return sVar4;
}

Assistant:

static sxi32 VmJsonEncode(
	jx9_value *pIn,          /* Encode this value */
	json_private_data *pData /* Context data */
	){
		SyBlob *pOut = pData->pOut;
		int nByte;
		if( jx9_value_is_null(pIn) || jx9_value_is_resource(pIn)){
			/* null */
			SyBlobAppend(pOut, "null", sizeof("null")-1);
		}else if( jx9_value_is_bool(pIn) ){
			int iBool = jx9_value_to_bool(pIn);
			sxu32 iLen;
			/* true/false */
			iLen = iBool ? sizeof("true") : sizeof("false");
			SyBlobAppend(pOut, iBool ? "true" : "false", iLen-1);
		}else if(  jx9_value_is_numeric(pIn) && !jx9_value_is_string(pIn) ){
			const char *zNum;
			/* Get a string representation of the number */
			zNum = jx9_value_to_string(pIn, &nByte);
			SyBlobAppend(pOut,zNum,nByte);
		}else if( jx9_value_is_string(pIn) ){
				const char *zIn, *zEnd;
				int c;
				/* Encode the string */
				zIn = jx9_value_to_string(pIn, &nByte);
				zEnd = &zIn[nByte];
				/* Append the double quote */
				SyBlobAppend(pOut,"\"", sizeof(char));
				for(;;){
					if( zIn >= zEnd ){
						/* No more input to process */
						break;
					}
					c = zIn[0];
					/* Advance the stream cursor */
					zIn++;
					if( c == '"' || c == '\\' ){
						/* Unescape the character */
						SyBlobAppend(pOut,"\\", sizeof(char));
					}
					/* Append character verbatim */
					SyBlobAppend(pOut,(const char *)&c,sizeof(char));
				}
				/* Append the double quote */
				SyBlobAppend(pOut,"\"",sizeof(char));
		}else if( jx9_value_is_json_array(pIn) ){
			/* Encode the array/object */
			pData->isFirst = 1;
			if( jx9_value_is_json_object(pIn) ){
				/* Encode the object instance */
				pData->isFirst = 1;
				/* Append the curly braces */
				SyBlobAppend(pOut, "{",sizeof(char));
				/* Iterate throw object attribute */
				jx9_array_walk(pIn,VmJsonObjectEncode, pData);
				/* Append the closing curly braces  */
				SyBlobAppend(pOut, "}",sizeof(char));
			}else{
				/* Append the square bracket or curly braces */
				SyBlobAppend(pOut,"[",sizeof(char));
				/* Iterate throw array entries */
				jx9_array_walk(pIn, VmJsonArrayEncode, pData);
				/* Append the closing square bracket or curly braces */
				SyBlobAppend(pOut,"]",sizeof(char));
			}
		}else{
			/* Can't happen */
			SyBlobAppend(pOut,"null",sizeof("null")-1);
		}
		/* All done */
		return JX9_OK;
}